

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Action::Action(Action *this,ActionType type,Location *loc)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  Location LStack_38;
  
  this->_vptr_Action = (_func_int **)&PTR__Action_001d7818;
  sVar1 = (loc->filename).size_;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->loc).filename.data_ = (loc->filename).data_;
  (this->loc).filename.size_ = sVar1;
  (this->loc).field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = uVar3;
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  Var::Var(&this->module_var,0xffffffff,&LStack_38);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->type_ = type;
  return;
}

Assistant:

explicit Action(ActionType type, const Location& loc = Location())
      : loc(loc), type_(type) {}